

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O2

void BrotliBuildMetaBlock
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,
               BrotliEncoderParams *params,uint8_t prev_byte,uint8_t prev_byte2,Command *cmds,
               size_t num_commands,ContextType literal_context_mode,
               BlockSplitFromDecoder *literals_block_splits_decoder,size_t *current_block_literals,
               BlockSplitFromDecoder *cmds_block_splits_decoder,size_t *current_block_cmds,
               MetaBlockSplit *mb)

{
  BrotliDistanceParams *pBVar1;
  BlockSplit *dist_split;
  ulong uVar2;
  BrotliDistanceParams *orig_params_00;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  HistogramLiteral *pHVar7;
  ContextType *context_modes;
  HistogramDistance *pHVar8;
  HistogramCommand *__s;
  size_t sVar9;
  uint32_t *puVar10;
  byte bVar11;
  uint uVar12;
  size_t sVar13;
  ulong uVar14;
  long lVar15;
  uint16_t *puVar16;
  long lVar17;
  size_t sVar18;
  uint32_t ndirect;
  HistogramLiteral *literal_histograms;
  HistogramDistance *copy_dist_histograms;
  uint32_t uVar19;
  ulong uVar20;
  bool bVar21;
  double local_1c8;
  double dist_cost;
  size_t *local_170;
  BlockSplitFromDecoder *local_168;
  size_t *local_160;
  BlockSplitFromDecoder *local_158;
  BrotliEncoderParams new_params;
  BrotliEncoderParams orig_params;
  
  local_170 = current_block_cmds;
  local_168 = cmds_block_splits_decoder;
  local_160 = current_block_literals;
  local_158 = literals_block_splits_decoder;
  memcpy(&orig_params,params,0x90);
  memcpy(&new_params,params,0x90);
  uVar4 = orig_params.dist.num_direct_distance_codes;
  uVar3 = orig_params.dist.distance_postfix_bits;
  orig_params_00 = &orig_params.dist;
  pBVar1 = &params->dist;
  local_1c8 = 1e+99;
  bVar21 = true;
  uVar19 = 0;
  uVar6 = 0;
  do {
    if (uVar19 == 4) {
      if ((bVar21) &&
         (ComputeDistanceCost(cmds,num_commands,orig_params_00,orig_params_00,&dist_cost),
         dist_cost < local_1c8)) {
        (params->dist).max_distance = orig_params.dist.max_distance;
        pBVar1->distance_postfix_bits = orig_params.dist.distance_postfix_bits;
        pBVar1->num_direct_distance_codes = orig_params.dist.num_direct_distance_codes;
        (params->dist).alphabet_size_max = orig_params.dist.alphabet_size_max;
        (params->dist).alphabet_size_limit = orig_params.dist.alphabet_size_limit;
      }
      if ((uVar3 != pBVar1->distance_postfix_bits) ||
         (uVar4 != (params->dist).num_direct_distance_codes)) {
        puVar16 = &cmds->dist_prefix_;
        sVar13 = num_commands;
        while (bVar21 = sVar13 != 0, sVar13 = sVar13 - 1, bVar21) {
          if (((*(uint *)(puVar16 + -5) & 0x1ffffff) != 0) && (0x7f < puVar16[-1])) {
            uVar6 = *puVar16 & 0x3ff;
            if (uVar4 + 0x10 <= uVar6) {
              uVar6 = (uVar6 - uVar4) - 0x10;
              uVar6 = (uVar6 & ~(-1 << ((byte)uVar3 & 0x1f))) + uVar4 + 0x10 +
                      ((((uVar6 >> (uVar3 & 0x1f) & 1) != 0) + 2 << ((byte)(*puVar16 >> 10) & 0x1f))
                       + *(uint32_t *)(puVar16 + -3) + -4 << ((byte)uVar3 & 0x1f));
            }
            uVar20 = (ulong)uVar6;
            uVar14 = (ulong)(params->dist).num_direct_distance_codes;
            uVar2 = uVar14 + 0x10;
            if (uVar20 < uVar2) {
              uVar19 = 0;
            }
            else {
              bVar11 = (byte)pBVar1->distance_postfix_bits;
              uVar14 = ((4L << (bVar11 & 0x3f)) + (uVar20 - uVar14)) - 0x10;
              uVar6 = 0x1f;
              uVar12 = (uint)uVar14;
              if (uVar12 != 0) {
                for (; uVar12 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              uVar6 = (uVar6 ^ 0xffffffe0) + 0x1f;
              bVar21 = (uVar14 >> ((ulong)uVar6 & 0x3f) & 1) != 0;
              iVar5 = uVar6 - pBVar1->distance_postfix_bits;
              uVar20 = (ulong)(((uint)bVar21 + iVar5 * 2 + 0xfffe << (bVar11 & 0x3f)) +
                               (int)uVar2 + (~(-1 << (bVar11 & 0x1f)) & uVar12) | iVar5 * 0x400);
              uVar19 = (uint32_t)
                       (uVar14 - ((ulong)bVar21 + 2 << ((byte)uVar6 & 0x3f)) >> (bVar11 & 0x3f));
            }
            *puVar16 = (ushort)uVar20;
            *(uint32_t *)(puVar16 + -3) = uVar19;
          }
          puVar16 = puVar16 + 8;
        }
      }
      dist_split = &mb->distance_split;
      BrotliSplitBlock(m,cmds,num_commands,ringbuffer,pos,mask,params,&mb->literal_split,
                       &mb->command_split,dist_split,local_158,local_160,local_168,local_170);
      sVar13 = (mb->literal_split).num_types;
      if (params->disable_literal_context_modeling == 0) {
        if (sVar13 == 0) {
          sVar13 = 0;
          context_modes = (ContextType *)0x0;
        }
        else {
          context_modes = (ContextType *)BrotliAllocate(m,sVar13 << 2);
          sVar13 = (mb->literal_split).num_types;
        }
        lVar17 = 0x40;
        for (sVar18 = 0; sVar13 != sVar18; sVar18 = sVar18 + 1) {
          context_modes[sVar18] = literal_context_mode;
        }
      }
      else {
        context_modes = (ContextType *)0x0;
        lVar17 = 1;
      }
      sVar13 = sVar13 * lVar17;
      sVar18 = sVar13;
      if (sVar13 == 0) {
        pHVar7 = (HistogramLiteral *)0x0;
        literal_histograms = pHVar7;
      }
      else {
        pHVar7 = (HistogramLiteral *)BrotliAllocate(m,sVar13 * 0x410);
        literal_histograms = pHVar7;
      }
      while (sVar18 != 0) {
        memset(pHVar7,0,0x408);
        pHVar7->bit_cost_ = INFINITY;
        pHVar7 = pHVar7 + 1;
        sVar18 = sVar18 - 1;
      }
      lVar17 = dist_split->num_types * 4;
      if (lVar17 == 0) {
        pHVar8 = (HistogramDistance *)0x0;
        copy_dist_histograms = pHVar8;
      }
      else {
        pHVar8 = (HistogramDistance *)BrotliAllocate(m,dist_split->num_types * 0x2240);
        copy_dist_histograms = pHVar8;
      }
      while (bVar21 = lVar17 != 0, lVar17 = lVar17 + -1, bVar21) {
        memset(pHVar8,0,0x888);
        pHVar8->bit_cost_ = INFINITY;
        pHVar8 = pHVar8 + 1;
      }
      sVar18 = (mb->command_split).num_types;
      mb->command_histograms_size = sVar18;
      if (sVar18 == 0) {
        sVar18 = 0;
        __s = (HistogramCommand *)0x0;
      }
      else {
        __s = (HistogramCommand *)BrotliAllocate(m,sVar18 * 0xb10);
        sVar18 = mb->command_histograms_size;
      }
      mb->command_histograms = __s;
      while (bVar21 = sVar18 != 0, sVar18 = sVar18 - 1, bVar21) {
        memset(__s,0,0xb08);
        __s->bit_cost_ = INFINITY;
        __s = __s + 1;
      }
      BrotliBuildHistogramsWithContext
                (cmds,num_commands,&mb->literal_split,&mb->command_split,dist_split,ringbuffer,pos,
                 mask,prev_byte,prev_byte2,context_modes,literal_histograms,mb->command_histograms,
                 copy_dist_histograms);
      BrotliFree(m,context_modes);
      sVar18 = (mb->literal_split).num_types;
      sVar9 = sVar18 << 6;
      mb->literal_context_map_size = sVar9;
      if (sVar9 == 0) {
        mb->literal_context_map = (uint32_t *)0x0;
        mb->literal_histograms_size = 0;
        puVar10 = (uint32_t *)0x0;
        pHVar7 = (HistogramLiteral *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,sVar18 << 8);
        sVar18 = mb->literal_context_map_size;
        mb->literal_context_map = puVar10;
        mb->literal_histograms_size = sVar18;
        if (sVar18 == 0) {
          pHVar7 = (HistogramLiteral *)0x0;
        }
        else {
          pHVar7 = (HistogramLiteral *)BrotliAllocate(m,sVar18 * 0x410);
          puVar10 = mb->literal_context_map;
        }
      }
      mb->literal_histograms = pHVar7;
      BrotliClusterHistogramsLiteral
                (m,literal_histograms,sVar13,0x100,pHVar7,&mb->literal_histograms_size,puVar10);
      BrotliFree(m,literal_histograms);
      if (params->disable_literal_context_modeling != 0) {
        sVar13 = (mb->literal_split).num_types;
        lVar17 = sVar13 << 8;
        while (bVar21 = sVar13 != 0, sVar13 = sVar13 - 1, bVar21) {
          puVar10 = mb->literal_context_map;
          for (lVar15 = -0x100; lVar15 != 0; lVar15 = lVar15 + 4) {
            *(uint32_t *)((long)puVar10 + lVar15 + lVar17) = puVar10[sVar13];
          }
          lVar17 = lVar17 + -0x100;
        }
      }
      sVar18 = (mb->distance_split).num_types;
      sVar13 = sVar18 * 4;
      mb->distance_context_map_size = sVar13;
      if (sVar13 == 0) {
        mb->distance_context_map = (uint32_t *)0x0;
        mb->distance_histograms_size = 0;
        puVar10 = (uint32_t *)0x0;
        sVar13 = 0;
        pHVar8 = (HistogramDistance *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,sVar18 << 4);
        sVar13 = mb->distance_context_map_size;
        mb->distance_context_map = puVar10;
        mb->distance_histograms_size = sVar13;
        if (sVar13 == 0) {
          sVar13 = 0;
          pHVar8 = (HistogramDistance *)0x0;
        }
        else {
          pHVar8 = (HistogramDistance *)BrotliAllocate(m,sVar13 * 0x890);
          puVar10 = mb->distance_context_map;
          sVar13 = mb->distance_context_map_size;
        }
      }
      mb->distance_histograms = pHVar8;
      BrotliClusterHistogramsDistance
                (m,copy_dist_histograms,sVar13,0x100,pHVar8,&mb->distance_histograms_size,puVar10);
      BrotliFree(m,copy_dist_histograms);
      return;
    }
    uVar12 = uVar6 - 1;
    while (uVar6 = uVar12 + 1, uVar6 < 0x10) {
      ndirect = uVar6 << ((byte)uVar19 & 0x1f);
      BrotliInitDistanceParams(&new_params,uVar19,ndirect);
      if (ndirect == uVar4 && uVar19 == uVar3) {
        bVar21 = false;
      }
      iVar5 = ComputeDistanceCost(cmds,num_commands,orig_params_00,&new_params.dist,&dist_cost);
      if ((iVar5 == 0) || (local_1c8 < dist_cost)) break;
      (params->dist).max_distance = new_params.dist.max_distance;
      pBVar1->distance_postfix_bits = new_params.dist.distance_postfix_bits;
      pBVar1->num_direct_distance_codes = new_params.dist.num_direct_distance_codes;
      (params->dist).alphabet_size_max = new_params.dist.alphabet_size_max;
      (params->dist).alphabet_size_limit = new_params.dist.alphabet_size_limit;
      uVar12 = uVar6;
      local_1c8 = dist_cost;
    }
    uVar6 = uVar12 >> 1;
    if (uVar12 == 0xffffffff) {
      uVar6 = 0;
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

void BrotliBuildMetaBlock(MemoryManager* m,
                      const uint8_t* ringbuffer,
                      const size_t pos,
                      const size_t mask,
                      BrotliEncoderParams* params,
                      uint8_t prev_byte,
                      uint8_t prev_byte2,
                      Command* cmds,
                      size_t num_commands,
                      ContextType literal_context_mode,
                      const BlockSplitFromDecoder* literals_block_splits_decoder,
                      size_t* current_block_literals,
                      const BlockSplitFromDecoder* cmds_block_splits_decoder,
                      size_t* current_block_cmds,
                      MetaBlockSplit* mb) {
  static const size_t kMaxNumberOfHistograms = 256;
  HistogramDistance* distance_histograms;
  HistogramLiteral* literal_histograms;
  ContextType* literal_context_modes = NULL;
  size_t literal_histograms_size;
  size_t distance_histograms_size;
  size_t i;
  size_t literal_context_multiplier = 1;
  uint32_t npostfix;
  uint32_t ndirect_msb = 0;
  BROTLI_BOOL check_orig = BROTLI_TRUE;
  double best_dist_cost = 1e99;
  BrotliEncoderParams orig_params = *params;
  BrotliEncoderParams new_params = *params;

  for (npostfix = 0; npostfix <= BROTLI_MAX_NPOSTFIX; npostfix++) {
    for (; ndirect_msb < 16; ndirect_msb++) {
      uint32_t ndirect = ndirect_msb << npostfix;
      BROTLI_BOOL skip;
      double dist_cost;
      BrotliInitDistanceParams(&new_params, npostfix, ndirect);
      if (npostfix == orig_params.dist.distance_postfix_bits &&
          ndirect == orig_params.dist.num_direct_distance_codes) {
        check_orig = BROTLI_FALSE;
      }
      skip = !ComputeDistanceCost(
          cmds, num_commands,
          &orig_params.dist, &new_params.dist, &dist_cost);
      if (skip || (dist_cost > best_dist_cost)) {
        break;
      }
      best_dist_cost = dist_cost;
      params->dist = new_params.dist;
    }
    if (ndirect_msb > 0) ndirect_msb--;
    ndirect_msb /= 2;
  }
  if (check_orig) {
    double dist_cost;
    ComputeDistanceCost(cmds, num_commands,
                        &orig_params.dist, &orig_params.dist, &dist_cost);
    if (dist_cost < best_dist_cost) {
      /* NB: currently unused; uncomment when more param tuning is added. */
      /* best_dist_cost = dist_cost; */
      params->dist = orig_params.dist;
    }
  }
  RecomputeDistancePrefixes(cmds, num_commands,
                            &orig_params.dist, &params->dist);
  BrotliSplitBlock(m, cmds, num_commands,
                   ringbuffer, pos, mask, params,
                   &mb->literal_split,
                   &mb->command_split,
                   &mb->distance_split,
                   literals_block_splits_decoder, current_block_literals,
                   cmds_block_splits_decoder, current_block_cmds);

  if (BROTLI_IS_OOM(m)) return;
  if (!params->disable_literal_context_modeling) {
    literal_context_multiplier = 1 << BROTLI_LITERAL_CONTEXT_BITS;
    literal_context_modes =
        BROTLI_ALLOC(m, ContextType, mb->literal_split.num_types);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literal_context_modes)) return;
    for (i = 0; i < mb->literal_split.num_types; ++i) {
      literal_context_modes[i] = literal_context_mode;
    }
  }
  literal_histograms_size =
      mb->literal_split.num_types * literal_context_multiplier;
  literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, literal_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literal_histograms)) return;
  ClearHistogramsLiteral(literal_histograms, literal_histograms_size);

  distance_histograms_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, distance_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(distance_histograms)) return;
  ClearHistogramsDistance(distance_histograms, distance_histograms_size);
  BROTLI_DCHECK(mb->command_histograms == 0);
  mb->command_histograms_size = mb->command_split.num_types;
  mb->command_histograms =
      BROTLI_ALLOC(m, HistogramCommand, mb->command_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->command_histograms)) return;
  ClearHistogramsCommand(mb->command_histograms, mb->command_histograms_size);
  BrotliBuildHistogramsWithContext(cmds, num_commands,
      &mb->literal_split, &mb->command_split, &mb->distance_split,
      ringbuffer, pos, mask, prev_byte, prev_byte2, literal_context_modes,
      literal_histograms, mb->command_histograms, distance_histograms);
  BROTLI_FREE(m, literal_context_modes);
  BROTLI_DCHECK(mb->literal_context_map == 0);
  mb->literal_context_map_size =
      mb->literal_split.num_types << BROTLI_LITERAL_CONTEXT_BITS;
  mb->literal_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->literal_context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->literal_context_map)) return;

  BROTLI_DCHECK(mb->literal_histograms == 0);
  mb->literal_histograms_size = mb->literal_context_map_size;
  mb->literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, mb->literal_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->literal_histograms)) return;

  BrotliClusterHistogramsLiteral(m, literal_histograms, literal_histograms_size,
      kMaxNumberOfHistograms, mb->literal_histograms,
      &mb->literal_histograms_size, mb->literal_context_map);

  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, literal_histograms);

  if (params->disable_literal_context_modeling) {
    /* Distribute assignment to all contexts. */
    for (i = mb->literal_split.num_types; i != 0;) {
      size_t j = 0;
      i--;
      for (; j < (1 << BROTLI_LITERAL_CONTEXT_BITS); j++) {
        mb->literal_context_map[(i << BROTLI_LITERAL_CONTEXT_BITS) + j] =
            mb->literal_context_map[i];
      }
    }
  }
  BROTLI_DCHECK(mb->distance_context_map == 0);
  mb->distance_context_map_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  mb->distance_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->distance_context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->distance_context_map)) return;

  BROTLI_DCHECK(mb->distance_histograms == 0);
  mb->distance_histograms_size = mb->distance_context_map_size;
  mb->distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, mb->distance_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->distance_histograms)) return;

  BrotliClusterHistogramsDistance(m, distance_histograms,
                                  mb->distance_context_map_size,
                                  kMaxNumberOfHistograms,
                                  mb->distance_histograms,
                                  &mb->distance_histograms_size,
                                  mb->distance_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, distance_histograms);
}